

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

char * __thiscall
diligent_spirv_cross::CompilerGLSL::to_storage_qualifiers_glsl(CompilerGLSL *this,SPIRVariable *var)

{
  StorageClass SVar1;
  uint uVar2;
  ExecutionModel EVar3;
  bool bVar4;
  uint32_t location;
  SPIREntryPoint *pSVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  byte bVar9;
  
  pSVar5 = Compiler::get_entry_point(&this->super_Compiler);
  bVar4 = subpass_input_is_framebuffer_fetch(this,(var->super_IVariant).self.id);
  pcVar6 = "";
  if (!bVar4) {
    SVar1 = var->storage;
    if ((int)SVar1 < 0x14d0) {
      if (SVar1 < Image) {
        if ((0x605U >> (SVar1 & 0x1f) & 1) == 0) {
          if ((10U >> (SVar1 & 0x1f) & 1) != 0) {
            bVar4 = (this->options).es;
            uVar2 = (this->options).version;
            bVar9 = 1;
            bVar8 = uVar2 < 300 & bVar4;
            if (bVar8 == 0) {
              bVar9 = ~bVar4 & uVar2 < 0x82;
            }
            EVar3 = pSVar5->model;
            if ((EVar3 == ExecutionModelVertex & bVar9) == 1) {
              pcVar7 = "attribute ";
              pcVar6 = "varying ";
            }
            else {
              bVar9 = 1;
              if (bVar8 == 0) {
                bVar9 = ~bVar4 & uVar2 < 0x82;
              }
              if ((bVar9 & EVar3 == ExecutionModelFragment) != 0) {
                return "varying ";
              }
              if (SVar1 == Output && EVar3 == ExecutionModelFragment) {
                location = Compiler::get_decoration
                                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                      DecorationLocation);
                bVar4 = location_is_framebuffer_fetch(this,location);
                if (!bVar4) {
                  return "out ";
                }
                return "inout ";
              }
              pcVar7 = "in ";
              pcVar6 = "out ";
            }
            if (SVar1 == Input) {
              pcVar6 = pcVar7;
            }
          }
        }
        else {
          pcVar6 = "uniform ";
        }
      }
    }
    else {
      if ((int)SVar1 < 0x14da) {
        if (SVar1 == CallableDataKHR) {
          pcVar7 = "callableDataEXT ";
          pcVar6 = "callableDataNV ";
        }
        else {
          if (SVar1 != IncomingCallableDataKHR) {
            return pcVar6;
          }
          pcVar7 = "callableDataInEXT ";
          pcVar6 = "callableDataInNV ";
        }
      }
      else if (SVar1 == RayPayloadKHR) {
        pcVar7 = "rayPayloadEXT ";
        pcVar6 = "rayPayloadNV ";
      }
      else if (SVar1 == HitAttributeKHR) {
        pcVar7 = "hitAttributeEXT ";
        pcVar6 = "hitAttributeNV ";
      }
      else {
        if (SVar1 != IncomingRayPayloadKHR) {
          return pcVar6;
        }
        pcVar7 = "rayPayloadInEXT ";
        pcVar6 = "rayPayloadInNV ";
      }
      if (this->ray_tracing_is_khr != false) {
        pcVar6 = pcVar7;
      }
    }
  }
  return pcVar6;
}

Assistant:

const char *CompilerGLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
	{
		if (is_legacy() && execution.model == ExecutionModelVertex)
			return var.storage == StorageClassInput ? "attribute " : "varying ";
		else if (is_legacy() && execution.model == ExecutionModelFragment)
			return "varying "; // Fragment outputs are renamed so they never hit this case.
		else if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
		{
			uint32_t loc = get_decoration(var.self, DecorationLocation);
			bool is_inout = location_is_framebuffer_fetch(loc);
			if (is_inout)
				return "inout ";
			else
				return "out ";
		}
		else
			return var.storage == StorageClassInput ? "in " : "out ";
	}
	else if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	         var.storage == StorageClassPushConstant || var.storage == StorageClassAtomicCounter)
	{
		return "uniform ";
	}
	else if (var.storage == StorageClassRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadEXT " : "rayPayloadNV ";
	}
	else if (var.storage == StorageClassIncomingRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadInEXT " : "rayPayloadInNV ";
	}
	else if (var.storage == StorageClassHitAttributeKHR)
	{
		return ray_tracing_is_khr ? "hitAttributeEXT " : "hitAttributeNV ";
	}
	else if (var.storage == StorageClassCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataEXT " : "callableDataNV ";
	}
	else if (var.storage == StorageClassIncomingCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataInEXT " : "callableDataInNV ";
	}

	return "";
}